

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLMaterialRenderer.h
# Opt level: O2

void __thiscall
irr::video::COpenGLMaterialRenderer_ONETEXTURE_BLEND::OnSetMaterial
          (COpenGLMaterialRenderer_ONETEXTURE_BLEND *this,SMaterial *material,
          SMaterial *lastMaterial,bool resetAllRenderstates,IMaterialRendererServices *services)

{
  f32 fVar1;
  long *plVar2;
  COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
  *this_00;
  int iVar3;
  GLenum source;
  GLenum destination;
  GLenum sourceAlpha;
  GLenum destinationAlpha;
  undefined7 in_register_00000009;
  undefined8 uVar4;
  E_BLEND_FACTOR factor;
  E_BLEND_FACTOR factor_00;
  undefined8 uVar5;
  COpenGLDriver *pCVar6;
  u32 state;
  uint uVar7;
  E_BLEND_FACTOR factor_01;
  
  pCVar6 = *(COpenGLDriver **)&(this->super_IMaterialRenderer).field_0x8;
  pCVar6->FixedPipelineState = (uint)(pCVar6->FixedPipelineState == EOFPS_DISABLE) * 3;
  COpenGLDriver::disableTextures(pCVar6,1);
  plVar2 = *(long **)&(this->super_IMaterialRenderer).field_0x8;
  (**(code **)(*plVar2 + 0x3c0))
            (plVar2,material,lastMaterial,
             CONCAT71(in_register_00000009,resetAllRenderstates) & 0xffffffff);
  fVar1 = material->MaterialTypeParam;
  factor_00 = (uint)fVar1 >> 0xc & (EBF_DST_ALPHA|EBF_ONE_MINUS_SRC_ALPHA);
  factor = (uint)fVar1 >> 8 & (EBF_DST_ALPHA|EBF_ONE_MINUS_SRC_ALPHA);
  factor_01 = (uint)fVar1 >> 4 & (EBF_DST_ALPHA|EBF_ONE_MINUS_SRC_ALPHA);
  COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
  ::setBlend(*(COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
               **)(*(long *)&(this->super_IMaterialRenderer).field_0x8 + 0xbe8),true);
  pCVar6 = *(COpenGLDriver **)&(this->super_IMaterialRenderer).field_0x8;
  iVar3 = (*(pCVar6->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[2])(pCVar6,0x22);
  this_00 = *(COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
              **)(*(long *)&(this->super_IMaterialRenderer).field_0x8 + 0xbe8);
  source = COpenGLDriver::getGLBlend(pCVar6,factor_01);
  destination = COpenGLDriver::getGLBlend
                          (pCVar6,(uint)fVar1 & (EBF_DST_ALPHA|EBF_ONE_MINUS_SRC_ALPHA));
  if ((char)iVar3 == '\0') {
    COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
    ::setBlendFunc(this_00,source,destination);
  }
  else {
    sourceAlpha = COpenGLDriver::getGLBlend(pCVar6,factor_00);
    destinationAlpha = COpenGLDriver::getGLBlend(pCVar6,factor);
    COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
    ::setBlendFuncSeparate(this_00,source,destination,sourceAlpha,destinationAlpha);
  }
  COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
  ::setActiveTexture(*(COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                       **)(*(long *)&(this->super_IMaterialRenderer).field_0x8 + 0xbe8),0x84c0);
  glTexEnvi(0x2300,0x2200,0x8570);
  glTexEnvi(0x2300,0x8571,0x2100);
  glTexEnvi(0x2300,0x8580,0x1702);
  glTexEnvi(0x2300,0x8581,0x8578);
  glTexEnvf((float)((uint)fVar1 >> 0x10 & 0xf),0x2300,0x8573);
  if ((((4 < factor_01 - EBF_SRC_ALPHA) &&
       (4 < ((uint)fVar1 & (EBF_DST_ALPHA|EBF_ONE_MINUS_SRC_ALPHA)) - EBF_SRC_ALPHA)) &&
      (4 < factor_00 - EBF_SRC_ALPHA)) && (4 < factor - EBF_SRC_ALPHA)) {
    return;
  }
  uVar7 = (uint)fVar1 >> 0x14 & 0xf;
  if (uVar7 == 2) {
    glTexEnvi(0x2300,0x8572,0x1e01);
    uVar5 = 0x8588;
  }
  else {
    if (uVar7 == 1) {
      glTexEnvi(0x2300,0x8572,0x1e01);
      uVar5 = 0x8588;
      uVar4 = 0x8577;
      goto LAB_00204bad;
    }
    glTexEnvi(0x2300,0x8572,0x2100);
    glTexEnvi(0x2300,0x8588,0x8577);
    uVar5 = 0x8589;
  }
  uVar4 = 0x1702;
LAB_00204bad:
  glTexEnvi(0x2300,uVar5,uVar4);
  return;
}

Assistant:

virtual void OnSetMaterial(const SMaterial &material, const SMaterial &lastMaterial,
			bool resetAllRenderstates, IMaterialRendererServices *services) override
	{
		if (Driver->getFixedPipelineState() == COpenGLDriver::EOFPS_DISABLE)
			Driver->setFixedPipelineState(COpenGLDriver::EOFPS_DISABLE_TO_ENABLE);
		else
			Driver->setFixedPipelineState(COpenGLDriver::EOFPS_ENABLE);

		Driver->disableTextures(1);
		Driver->setBasicRenderStates(material, lastMaterial, resetAllRenderstates);

		//		if (material.MaterialType != lastMaterial.MaterialType ||
		//			material.MaterialTypeParam != lastMaterial.MaterialTypeParam ||
		//			resetAllRenderstates)
		{
			E_BLEND_FACTOR srcRGBFact, dstRGBFact, srcAlphaFact, dstAlphaFact;
			E_MODULATE_FUNC modulate;
			u32 alphaSource;
			unpack_textureBlendFuncSeparate(srcRGBFact, dstRGBFact, srcAlphaFact, dstAlphaFact, modulate, alphaSource, material.MaterialTypeParam);

			Driver->getCacheHandler()->setBlend(true);

			if (Driver->queryFeature(EVDF_BLEND_SEPARATE)) {
				Driver->getCacheHandler()->setBlendFuncSeparate(Driver->getGLBlend(srcRGBFact), Driver->getGLBlend(dstRGBFact),
						Driver->getGLBlend(srcAlphaFact), Driver->getGLBlend(dstAlphaFact));
			} else {
				Driver->getCacheHandler()->setBlendFunc(Driver->getGLBlend(srcRGBFact), Driver->getGLBlend(dstRGBFact));
			}

			Driver->getCacheHandler()->setActiveTexture(GL_TEXTURE0_ARB);

#ifdef GL_ARB_texture_env_combine
			glTexEnvi(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, GL_COMBINE_ARB);
			glTexEnvi(GL_TEXTURE_ENV, GL_COMBINE_RGB_ARB, GL_MODULATE);
			glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE0_RGB_ARB, GL_TEXTURE);
			glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE1_RGB_ARB, GL_PREVIOUS_ARB);
			glTexEnvf(GL_TEXTURE_ENV, GL_RGB_SCALE_ARB, (f32)modulate);
#else
			glTexEnvi(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, GL_COMBINE_EXT);
			glTexEnvi(GL_TEXTURE_ENV, GL_COMBINE_RGB_EXT, GL_MODULATE);
			glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE0_RGB_EXT, GL_TEXTURE);
			glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE1_RGB_EXT, GL_PREVIOUS_EXT);
			glTexEnvf(GL_TEXTURE_ENV, GL_RGB_SCALE_EXT, (f32)modulate);
#endif

			if (textureBlendFunc_hasAlpha(srcRGBFact) || textureBlendFunc_hasAlpha(dstRGBFact) ||
					textureBlendFunc_hasAlpha(srcAlphaFact) || textureBlendFunc_hasAlpha(dstAlphaFact)) {
				if (alphaSource == EAS_VERTEX_COLOR) {
#ifdef GL_ARB_texture_env_combine
					glTexEnvi(GL_TEXTURE_ENV, GL_COMBINE_ALPHA_ARB, GL_REPLACE);
					glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE0_ALPHA_ARB, GL_PRIMARY_COLOR_ARB);
#else
					glTexEnvi(GL_TEXTURE_ENV, GL_COMBINE_ALPHA_EXT, GL_REPLACE);
					glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE0_ALPHA_EXT, GL_PRIMARY_COLOR_EXT);
#endif
				} else if (alphaSource == EAS_TEXTURE) {
#ifdef GL_ARB_texture_env_combine
					glTexEnvi(GL_TEXTURE_ENV, GL_COMBINE_ALPHA_ARB, GL_REPLACE);
					glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE0_ALPHA_ARB, GL_TEXTURE);
#else
					glTexEnvi(GL_TEXTURE_ENV, GL_COMBINE_ALPHA_EXT, GL_REPLACE);
					glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE0_ALPHA_EXT, GL_TEXTURE);
#endif
				} else {
#ifdef GL_ARB_texture_env_combine
					glTexEnvi(GL_TEXTURE_ENV, GL_COMBINE_ALPHA_ARB, GL_MODULATE);
					glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE0_ALPHA_ARB, GL_PRIMARY_COLOR_ARB);
					glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE1_ALPHA_ARB, GL_TEXTURE);
#else
					glTexEnvi(GL_TEXTURE_ENV, GL_COMBINE_ALPHA_EXT, GL_MODULATE);
					glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE0_ALPHA_EXT, GL_PRIMARY_COLOR_EXT);
					glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE1_ALPHA_EXT, GL_TEXTURE);
#endif
				}
			}
		}
	}